

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  TValue y;
  int iVar1;
  ulong uVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  MMS mm;
  double dVar5;
  TValue tempc;
  TValue tempb;
  TValue local_40;
  TValue local_38;
  
  mm = (MMS)(lj_bc_mode[op] >> 0xb);
  uVar2 = rb->it64 >> 0x2f;
  pTVar4 = rb;
  if (0xfffffffffffffff1 < uVar2) {
    if (uVar2 != 0xfffffffffffffffb) goto LAB_001185ab;
    pTVar4 = &local_38;
    iVar1 = lj_strscan_num((GCstr *)(rb->it64 & 0x7fffffffffff),pTVar4);
    if (iVar1 == 0) goto LAB_001185ab;
  }
  y = (TValue)rc->it64;
  if (((ulong)(y.it64 >> 0x2f) < 0xfffffffffffffff2) ||
     ((y.it64 >> 0x2f == 0xfffffffffffffffb &&
      (iVar1 = lj_strscan_num((GCstr *)(y.u64 & 0x7fffffffffff),&local_40), y = local_40, iVar1 != 0
      )))) {
    dVar5 = lj_vm_foldarith(pTVar4->n,y.n,mm - MM_add);
    ra->n = dVar5;
    return (TValue *)0x0;
  }
LAB_001185ab:
  pcVar3 = lj_meta_lookup(L,rb,mm);
  if ((pcVar3->u64 == 0xffffffffffffffff) &&
     (pcVar3 = lj_meta_lookup(L,rc,mm), pcVar3->u64 == 0xffffffffffffffff)) {
    pcVar3 = str2num(rb,&local_38);
    if (pcVar3 == (cTValue *)0x0) {
      rc = rb;
    }
    lj_err_optype(L,rc,LJ_ERR_OPARITH);
  }
  uVar2 = L->base[-2].u64 & 0x7fffffffffff;
  if (*(char *)(uVar2 + 10) == '\0') {
    pTVar4 = L->base + *(byte *)(*(long *)(uVar2 + 0x20) + -0x5d);
  }
  else {
    pTVar4 = L->top;
  }
  pTVar4->n = (lua_Number)lj_cont_ra;
  pTVar4[1].u64 = 0xffffffffffffffff;
  pTVar4[2] = *pcVar3;
  pTVar4[3].u64 = 0xffffffffffffffff;
  pTVar4[4] = *rb;
  pTVar4[5] = *rc;
  return pTVar4 + 4;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}